

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

ptls_cipher_suite_t * get_aes128gcmsha256(quicly_context_t *ctx)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  
  pppVar2 = ctx->tls->cipher_suites;
  if (pppVar2 != (ptls_cipher_suite_t **)0x0) {
    do {
      ppVar1 = *pppVar2;
      pppVar2 = pppVar2 + 1;
    } while (ppVar1->id != 0x1301);
    return ppVar1;
  }
  __assert_fail("cs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
}

Assistant:

static ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *ctx)
{
    ptls_cipher_suite_t **cs;

    for (cs = ctx->tls->cipher_suites;; ++cs) {
        assert(cs != NULL);
        if ((*cs)->id == PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)
            break;
    }
    return *cs;
}